

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_internal.h
# Opt level: O1

RawTransactionResponseStruct * __thiscall
cfd::js::api::
ExecuteStructApi<cfd::js::api::UpdateTxOutAmountRequestStruct,cfd::js::api::RawTransactionResponseStruct>
          (RawTransactionResponseStruct *__return_storage_ptr__,api *this,
          UpdateTxOutAmountRequestStruct *request,
          function<cfd::js::api::RawTransactionResponseStruct_(const_cfd::js::api::UpdateTxOutAmountRequestStruct_&)>
          *call_function,string *fuction_name)

{
  InnerErrorResponseStruct *this_00;
  _Rb_tree_header *p_Var1;
  CfdException *cfde;
  long *plVar2;
  _Rb_tree_header *p_Var3;
  undefined1 auVar4 [12];
  anon_enum_32 local_12c;
  CfdException local_128;
  undefined1 local_f8 [40];
  _Alloc_hider local_d0;
  char local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _Stack_60;
  
  (__return_storage_ptr__->hex)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->hex).field_2;
  (__return_storage_ptr__->hex)._M_string_length = 0;
  (__return_storage_ptr__->hex).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).code = 0;
  (__return_storage_ptr__->error).type._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).type.field_2;
  (__return_storage_ptr__->error).type._M_string_length = 0;
  (__return_storage_ptr__->error).type.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->error).message._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->error).message.field_2;
  (__return_storage_ptr__->error).message._M_string_length = 0;
  (__return_storage_ptr__->error).message.field_2._M_local_buf[0] = '\0';
  p_Var3 = &(__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var3->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var3->_M_header;
  (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  cfd::Initialize();
  if ((request->tx).field_2._M_allocated_capacity == 0) {
    auVar4 = std::__throw_bad_function_call();
    this_00 = &__return_storage_ptr__->error;
    if (auVar4._8_4_ == 3) {
      cfde = (CfdException *)__cxa_begin_catch(auVar4._0_8_);
      local_f8._0_8_ = "cfdjs_internal.h";
      local_f8._8_4_ = 0x32;
      local_f8._16_8_ = "ExecuteStructApi";
      local_12c = (**(code **)(*(long *)cfde + 0x18))(cfde);
      local_128._0_8_ = (**(code **)(*(long *)cfde + 0x10))(cfde);
      core::logger::log<std::__cxx11::string&,cfd::core::CfdError&,char_const*&>
                ((CfdSourceLocation *)local_f8,kCfdLogLevelWarning,
                 "Failed to {}. CfdException occurred:  code={}, message={}",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)call_function,
                 &local_12c,(char **)&local_128);
      ConvertCfdExceptionToStruct((InnerErrorResponseStruct *)local_f8,cfde);
      InnerErrorResponseStruct::operator=(this_00,(InnerErrorResponseStruct *)local_f8);
      InnerErrorResponseStruct::~InnerErrorResponseStruct((InnerErrorResponseStruct *)local_f8);
      __cxa_end_catch();
    }
    else {
      plVar2 = (long *)__cxa_begin_catch(auVar4._0_8_);
      if (auVar4._8_4_ == 2) {
        local_f8._0_8_ = "cfdjs_internal.h";
        local_f8._8_4_ = 0x38;
        local_f8._16_8_ = "ExecuteStructApi";
        local_128._0_8_ = (**(code **)(*plVar2 + 0x10))(plVar2);
        core::logger::log<std::__cxx11::string&,char_const*&>
                  ((CfdSourceLocation *)local_f8,kCfdLogLevelWarning,
                   "Failed to {}. Exception occurred: message={}",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   call_function,(char **)&local_128);
        core::CfdException::CfdException(&local_128);
        ConvertCfdExceptionToStruct((InnerErrorResponseStruct *)local_f8,&local_128);
        InnerErrorResponseStruct::operator=(this_00,(InnerErrorResponseStruct *)local_f8);
        InnerErrorResponseStruct::~InnerErrorResponseStruct((InnerErrorResponseStruct *)local_f8);
        core::CfdException::~CfdException(&local_128);
        __cxa_end_catch();
      }
      else {
        local_f8._0_8_ = "cfdjs_internal.h";
        local_f8._8_4_ = 0x3d;
        local_f8._16_8_ = "ExecuteStructApi";
        core::logger::log<std::__cxx11::string&>
                  ((CfdSourceLocation *)local_f8,kCfdLogLevelWarning,
                   "Failed to {}. Unknown exception occurred.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   call_function);
        core::CfdException::CfdException(&local_128);
        ConvertCfdExceptionToStruct((InnerErrorResponseStruct *)local_f8,&local_128);
        InnerErrorResponseStruct::operator=(this_00,(InnerErrorResponseStruct *)local_f8);
        InnerErrorResponseStruct::~InnerErrorResponseStruct((InnerErrorResponseStruct *)local_f8);
        core::CfdException::~CfdException(&local_128);
        __cxa_end_catch();
      }
    }
  }
  else {
    (**(code **)((long)&(request->tx).field_2 + 8))(local_f8,request,this);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_f8);
    (__return_storage_ptr__->error).code = local_f8._32_4_;
    std::__cxx11::string::operator=
              ((string *)&(__return_storage_ptr__->error).type,(string *)&local_d0);
    std::__cxx11::string::operator=
              ((string *)&(__return_storage_ptr__->error).message,(string *)local_b0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(__return_storage_ptr__->error).ignore_items._M_t);
    if (local_90._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var1 = &local_90._M_impl.super__Rb_tree_header;
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_color = local_90._M_impl.super__Rb_tree_header._M_header._M_color;
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_parent = local_90._M_impl.super__Rb_tree_header._M_header._M_parent;
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_left = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_header.
      _M_right = local_90._M_impl.super__Rb_tree_header._M_header._M_right;
      (local_90._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent = &p_Var3->_M_header;
      (__return_storage_ptr__->error).ignore_items._M_t._M_impl.super__Rb_tree_header._M_node_count
           = local_90._M_impl.super__Rb_tree_header._M_node_count;
      local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_90._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      local_90._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&(__return_storage_ptr__->ignore_items)._M_t);
    if (_Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
      p_Var3 = &_Stack_60._M_impl.super__Rb_tree_header;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           _Stack_60._M_impl.super__Rb_tree_header._M_header._M_color;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
           = _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right;
      (_Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent)->_M_parent =
           &(__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_header;
      (__return_storage_ptr__->ignore_items)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           _Stack_60._M_impl.super__Rb_tree_header._M_node_count;
      _Stack_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      _Stack_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      _Stack_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
      _Stack_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&_Stack_60);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_90);
    if (local_b0[0] != local_a0) {
      operator_delete(local_b0[0]);
    }
    if (local_d0._M_p != local_c0) {
      operator_delete(local_d0._M_p);
    }
    if ((undefined1 *)local_f8._0_8_ != local_f8 + 0x10) {
      operator_delete((void *)local_f8._0_8_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

ResponseStructType ExecuteStructApi(
    const RequestStructType& request,
    std::function<ResponseStructType(const RequestStructType&)> call_function,
    std::string fuction_name) {
  ResponseStructType response;
  try {
    cfd::Initialize();

    response = call_function(request);
  } catch (const CfdException& cfde) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to {}. CfdException occurred:  code={}, message={}",
        fuction_name, cfde.GetErrorCode(), cfde.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(cfde);
  } catch (const std::exception& except) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Exception occurred: message={}",
        fuction_name, except.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  } catch (...) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Unknown exception occurred.",
        fuction_name);
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  }
  return response;
}